

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

bool google::protobuf::CaseEqual(StringPiece s1,StringPiece s2)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  size_type sVar4;
  byte bVar5;
  size_type sVar6;
  
  sVar6 = s1.length_;
  if (sVar6 != s2.length_) {
    return false;
  }
  if (sVar6 == 0) {
    return true;
  }
  sVar4 = 0;
  do {
    bVar1 = s1.ptr_[sVar4];
    bVar2 = bVar1 + 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar2 = bVar1;
    }
    bVar1 = s2.ptr_[sVar4];
    bVar5 = bVar1 + 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar5 = bVar1;
    }
    iVar3 = (uint)bVar2 - (uint)bVar5;
    if (bVar2 != bVar5) goto LAB_0033a4a5;
    sVar4 = sVar4 + 1;
  } while (sVar6 != sVar4);
  iVar3 = 0;
LAB_0033a4a5:
  return iVar3 == 0;
}

Assistant:

inline bool CaseEqual(StringPiece s1, StringPiece s2) {
  if (s1.size() != s2.size()) return false;
  return memcasecmp(s1.data(), s2.data(), s1.size()) == 0;
}